

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

HighsTripletTreeSliceInOrder * __thiscall
presolve::HPresolve::getSortedRowVector(HPresolve *this,HighsInt row)

{
  int *piVar1;
  double *pdVar2;
  int *piVar3;
  HighsTripletTreeSliceInOrder *this_00;
  int in_EDX;
  long in_RSI;
  HighsTripletTreeSliceInOrder *in_RDI;
  HighsTripletTreeSliceInOrder *pHVar4;
  
  pHVar4 = in_RDI;
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x6fc4b9);
  pdVar2 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x6fc4cb);
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x6fc4e0);
  this_00 = (HighsTripletTreeSliceInOrder *)
            std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x6fc4f5);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xb8),(long)in_EDX);
  HighsTripletTreeSliceInOrder::HighsMatrixSlice
            (this_00,piVar3,pdVar2,piVar1,(HighsInt *)pHVar4,(HighsInt)((ulong)in_RSI >> 0x20));
  return in_RDI;
}

Assistant:

HighsTripletTreeSliceInOrder HPresolve::getSortedRowVector(HighsInt row) const {
  return HighsTripletTreeSliceInOrder(Acol.data(), Avalue.data(), ARleft.data(),
                                      ARright.data(), rowroot[row]);
}